

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O0

void __thiscall FDrawInfo::FDrawInfo(FDrawInfo *this)

{
  undefined8 *puVar1;
  GLDrawList *local_c0;
  GLDrawList *local_98;
  FDrawInfo *this_local;
  
  TArray<unsigned_char,_unsigned_char>::TArray(&this->sectorrenderflags);
  TArray<unsigned_char,_unsigned_char>::TArray(&this->ss_renderflags);
  TArray<unsigned_char,_unsigned_char>::TArray(&this->no_renderflags);
  TArray<FDrawInfo::MissingTextureInfo,_FDrawInfo::MissingTextureInfo>::TArray
            (&this->MissingUpperTextures);
  TArray<FDrawInfo::MissingTextureInfo,_FDrawInfo::MissingTextureInfo>::TArray
            (&this->MissingLowerTextures);
  TArray<FDrawInfo::MissingSegInfo,_FDrawInfo::MissingSegInfo>::TArray(&this->MissingUpperSegs);
  TArray<FDrawInfo::MissingSegInfo,_FDrawInfo::MissingSegInfo>::TArray(&this->MissingLowerSegs);
  TArray<FDrawInfo::SubsectorHackInfo,_FDrawInfo::SubsectorHackInfo>::TArray(&this->SubsectorHacks);
  TArray<gl_subsectorrendernode_*,_gl_subsectorrendernode_*>::TArray(&this->otherfloorplanes);
  TArray<gl_subsectorrendernode_*,_gl_subsectorrendernode_*>::TArray(&this->otherceilingplanes);
  TArray<sector_t_*,_sector_t_*>::TArray(&this->CeilingStacks);
  TArray<sector_t_*,_sector_t_*>::TArray(&this->FloorStacks);
  TArray<subsector_t_*,_subsector_t_*>::TArray(&this->HandledSubsectors);
  local_98 = this->drawlists;
  do {
    GLDrawList::GLDrawList(local_98);
    local_98 = local_98 + 1;
  } while (local_98 != (GLDrawList *)&this->dldrawlists);
  this->dldrawlists = (GLDrawList *)0x0;
  this->next = (FDrawInfo *)0x0;
  if ((gl.legacyMode & 1U) != 0) {
    puVar1 = (undefined8 *)operator_new__(0x2c8);
    *puVar1 = 8;
    local_c0 = (GLDrawList *)(puVar1 + 1);
    do {
      GLDrawList::GLDrawList(local_c0);
      local_c0 = local_c0 + 1;
    } while (local_c0 != (GLDrawList *)(puVar1 + 0x59));
    this->dldrawlists = (GLDrawList *)(puVar1 + 1);
  }
  return;
}

Assistant:

FDrawInfo::FDrawInfo()
{
	next = NULL;
	if (gl.legacyMode)
	{
		dldrawlists = new GLDrawList[GLLDL_TYPES];
	}
}